

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

void __thiscall
BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::fix_excess(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,int index)

{
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *data;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  **ppBVar1;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t *size2;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *split;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  item;
  
  ppBVar1 = b_array::
            Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>
            ::operator[](&this->subset,(long)index);
  data = *ppBVar1;
  if ((Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x2 < (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)data->data_size) {
    this_00 = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)operator_new(0x40);
    BPlusTree(this_00,this->duplicates_allowed);
    split = this_00;
    b_array::split<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>
              (&data->data,&data->data_size,&this_00->data,(size_t *)this_00);
    size2 = &this_00->subset_size;
    b_array::split<BPlusTree<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>*>
              (&data->subset,&data->subset_size,&this_00->subset,size2);
    this_00->next = data->next;
    data->next = this_00;
    b_array::detach_item<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>
              (&item,(b_array *)&data->data,
               (Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)data,size2);
    b_array::ordered_insert<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>
              (&this->data,&this->data_size,&item);
    b_array::insert_item<BPlusTree<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>*>
              (&this->subset,(long)(index + 1),&this->subset_size,&split);
    if (split->subset_size == 0) {
      b_array::ordered_insert<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>
                (&split->data,&split->data_size,&item);
    }
    MultiMap::
    Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Pair(&item);
  }
  return;
}

Assistant:

void BPlusTree<T>::fix_excess(int index) {
    BPlusTree<T>* node = subset[index];
    // dont do anything, why are we even here to begin with?
    if (node->data_size <= MAXIMUM)
        return;
    BPlusTree<T>* split = new BPlusTree<T>(duplicates_allowed);
    // split data and child
    b_array::split(node->data, node->data_size, split->data, split->data_size);
    b_array::split(node->subset, node->subset_size, split->subset,
                 split->subset_size);

    // connect the nodes together
    split->next = node->next;
    node->next = split;

    // insert the last item into self
    T item = b_array::detach_item(node->data, node->data_size);
    b_array::ordered_insert(data, data_size, item);
    b_array::insert_item(subset, index + 1, subset_size, split);

    // insert the item into the new node
    if (split->is_leaf())
        b_array::ordered_insert(split->data, split->data_size, item);
}